

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReferenceTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Reference_testThriftConversion_Test::~Reference_testThriftConversion_Test
          (Reference_testThriftConversion_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Reference, testThriftConversion)
{
    const SpanContext context;
    const Reference childRef(context, Reference::Type::ChildOfRef);
    thrift::SpanRef thriftChildRef;
    ASSERT_NO_THROW(childRef.thrift(thriftChildRef));
    const Reference followsFromRef(context, Reference::Type::FollowsFromRef);
    thrift::SpanRef thriftFollowsFromRef;
    ASSERT_NO_THROW(followsFromRef.thrift(thriftFollowsFromRef));
    const Reference invalidRef(context, static_cast<Reference::Type>(-1));
    thrift::SpanRef thriftInvalidRef;
    ASSERT_THROW(invalidRef.thrift(thriftInvalidRef), std::invalid_argument);
}